

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessState
          (Value *__return_storage_ptr__,Interpreter *this,Expression *param_1)

{
  string *this_00;
  string *this_01;
  ErrorCode EVar1;
  uint uVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  CommissionerAppPtr commissioner;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  char local_118 [16];
  _Alloc_hider local_108;
  size_type local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  CommissionerAppPtr local_e8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_e8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_e8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            (&local_58,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_e8);
  local_130._0_4_ = local_58.mCode;
  local_128._M_p = local_118;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_128,local_58.mMessage._M_dataplus._M_p,
             local_58.mMessage._M_dataplus._M_p + local_58.mMessage._M_string_length);
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  this_01 = &__return_storage_ptr__->mData;
  local_100 = 0;
  local_f8._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_130._0_4_;
  local_108._M_p = (pointer)&local_f8;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_128);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_108);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_p != &local_f8) {
    operator_delete(local_108._M_p);
  }
  if (local_128._M_p != local_118) {
    operator_delete(local_128._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
    operator_delete(local_58.mMessage._M_dataplus._M_p);
  }
  if (EVar1 == kNone) {
    uVar2 = (*((local_e8.
                super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0xb])();
    switch(uVar2 & 0xff) {
    case 0:
      paVar4 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"disabled","");
      Value::Value((Value *)local_130,&local_78);
      (__return_storage_ptr__->mError).mCode = local_130._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_128);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p);
      }
      _Var3._M_p = local_78._M_dataplus._M_p;
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
        _Var3._M_p = local_78._M_dataplus._M_p;
      }
      break;
    case 1:
      paVar4 = &local_98.field_2;
      local_98._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"connected","");
      Value::Value((Value *)local_130,&local_98);
      (__return_storage_ptr__->mError).mCode = local_130._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_128);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p);
      }
      _Var3._M_p = local_98._M_dataplus._M_p;
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
        _Var3._M_p = local_98._M_dataplus._M_p;
      }
      break;
    case 2:
      paVar4 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"petitioning","");
      Value::Value((Value *)local_130,&local_b8);
      (__return_storage_ptr__->mError).mCode = local_130._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_128);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p);
      }
      _Var3._M_p = local_b8._M_dataplus._M_p;
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
        _Var3._M_p = local_b8._M_dataplus._M_p;
      }
      break;
    case 3:
      paVar4 = &local_d8.field_2;
      local_d8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"active","");
      Value::Value((Value *)local_130,&local_d8);
      (__return_storage_ptr__->mError).mCode = local_130._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_128);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p);
      }
      _Var3._M_p = local_d8._M_dataplus._M_p;
      if (local_128._M_p != local_118) {
        operator_delete(local_128._M_p);
        _Var3._M_p = local_d8._M_dataplus._M_p;
      }
      break;
    default:
      goto switchD_00242c23_default;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != paVar4) {
      operator_delete(_Var3._M_p);
    }
  }
switchD_00242c23_default:
  if (local_e8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessState(const Expression &)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));

    switch (commissioner->GetState())
    {
    case State::kDisabled:
        value = std::string("disabled");
        break;
    case State::kConnected:
        value = std::string("connected");
        break;
    case State::kPetitioning:
        value = std::string("petitioning");
        break;
    case State::kActive:
        value = std::string("active");
        break;
    }

exit:
    return value;
}